

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.cpp
# Opt level: O0

bool __thiscall cashew::Ref::operator==(Ref *this,string_view str)

{
  string_view str_00;
  bool bVar1;
  Value *pVVar2;
  bool local_41;
  IString local_30;
  Ref *local_20;
  Ref *this_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (Ref *)str._M_len;
  local_20 = this;
  pVVar2 = get(this);
  bVar1 = cashew::Value::isString(pVVar2);
  local_41 = false;
  if (bVar1) {
    pVVar2 = get(this);
    str_00._M_str = (char *)str_local._M_len;
    str_00._M_len = (size_t)this_local;
    ::wasm::IString::IString(&local_30,str_00,true);
    local_41 = ::wasm::IString::operator==(&(pVVar2->field_1).str,&local_30);
  }
  return local_41;
}

Assistant:

bool Ref::operator==(std::string_view str) {
  return get()->isString() && get()->str == str;
}